

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::setEigenDecomposition
          (EigenDecompositionCube<float,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  int k_1;
  int j_1;
  int i_1;
  int l_1;
  int k;
  int j;
  int i;
  int l;
  double *inEigenValues_local;
  double *inInverseEigenVectors_local;
  double *inEigenVectors_local;
  int eigenIndex_local;
  EigenDecompositionCube<float,_1> *this_local;
  
  if (((this->super_EigenDecomposition<float,_1>).kFlags & 0x100000U) == 0) {
    l_1 = 0;
    for (i_1 = 0; i_1 < (this->super_EigenDecomposition<float,_1>).kStateCount; i_1 = i_1 + 1) {
      (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex][i_1] =
           (float)inEigenValues[i_1];
      for (j_1 = 0; j_1 < (this->super_EigenDecomposition<float,_1>).kStateCount; j_1 = j_1 + 1) {
        for (k_1 = 0; k_1 < (this->super_EigenDecomposition<float,_1>).kStateCount; k_1 = k_1 + 1) {
          this->gCMatrices[eigenIndex][l_1] =
               (float)(inEigenVectors
                       [i_1 * (this->super_EigenDecomposition<float,_1>).kStateCount + k_1] *
                      inInverseEigenVectors
                      [k_1 + j_1 * (this->super_EigenDecomposition<float,_1>).kStateCount]);
          l_1 = l_1 + 1;
        }
      }
    }
  }
  else {
    l = 0;
    for (i = 0; i < (this->super_EigenDecomposition<float,_1>).kStateCount; i = i + 1) {
      (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex][i] =
           (float)inEigenValues[i];
      for (j = 0; j < (this->super_EigenDecomposition<float,_1>).kStateCount; j = j + 1) {
        for (k = 0; k < (this->super_EigenDecomposition<float,_1>).kStateCount; k = k + 1) {
          this->gCMatrices[eigenIndex][l] =
               (float)(inEigenVectors
                       [i * (this->super_EigenDecomposition<float,_1>).kStateCount + k] *
                      inInverseEigenVectors
                      [k * (this->super_EigenDecomposition<float,_1>).kStateCount + j]);
          l = l + 1;
        }
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										           const double* inEigenVectors,
                                                   const double* inInverseEigenVectors,
                                                   const double* inEigenValues) {

    if (kFlags & BEAGLE_FLAG_INVEVEC_STANDARD) {
        int l = 0;
        for (int i = 0; i < kStateCount; i++) {
            gEigenValues[eigenIndex][i] = inEigenValues[i];
            for (int j = 0; j < kStateCount; j++) {
                for (int k = 0; k < kStateCount; k++) {
                    gCMatrices[eigenIndex][l] = inEigenVectors[(i * kStateCount) + k]
                            * inInverseEigenVectors[(k * kStateCount) + j];
                    l++;
                }
            }
        }
    } else {
        int l = 0;
        for (int i = 0; i < kStateCount; i++) {
            gEigenValues[eigenIndex][i] = inEigenValues[i];
            for (int j = 0; j < kStateCount; j++) {
                for (int k = 0; k < kStateCount; k++) {
                    gCMatrices[eigenIndex][l] = inEigenVectors[(i * kStateCount) + k]
                    * inInverseEigenVectors[k + (j*kStateCount)];
                    l++;
                }
            }
        }
    }

}